

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::transferPointer
               (SegmentBuilder *dstSegment,WirePointer *dst,SegmentBuilder *srcSegment,
               WirePointer *src)

{
  bool bVar1;
  word *srcPtr;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  WirePointer *src_local;
  SegmentBuilder *srcSegment_local;
  WirePointer *dst_local;
  SegmentBuilder *dstSegment_local;
  
  f.exception._6_1_ = WirePointer::isNull(dst);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    bVar1 = WirePointer::isNull(src);
    if (bVar1) {
      zeroMemory(dst);
    }
    else {
      bVar1 = WirePointer::isPositional(src);
      if (bVar1) {
        srcPtr = WirePointer::target(src);
        transferPointer(dstSegment,dst,srcSegment,src,srcPtr);
      }
      else {
        copyMemory<capnp::_::WirePointer>(dst,src);
      }
    }
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0x415,FAILED,"dst->isNull()","_kjCondition,",
             (DebugExpression<bool> *)((long)&f.exception + 7));
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

static void transferPointer(SegmentBuilder* dstSegment, WirePointer* dst,
                              SegmentBuilder* srcSegment, WirePointer* src) {
    // Make *dst point to the same object as *src.  Both must reside in the same message, but can
    // be in different segments.  Not always-inline because this is rarely used.
    //
    // Caller MUST zero out the source pointer after calling this, to make sure no later code
    // mistakenly thinks the source location still owns the object.  transferPointer() doesn't do
    // this zeroing itself because many callers transfer several pointers in a loop then zero out
    // the whole section.

    KJ_DASSERT(dst->isNull());
    // We expect the caller to ensure the target is already null so won't leak.

    if (src->isNull()) {
      zeroMemory(dst);
    } else if (src->isPositional()) {
      transferPointer(dstSegment, dst, srcSegment, src, src->target());
    } else {
      // Far and other pointers are position-independent, so we can just copy.
      copyMemory(dst, src);
    }
  }